

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::initStyleOption(QMenu *this,QStyleOptionMenuItem *option,QAction *action)

{
  byte *pbVar1;
  State *pSVar2;
  undefined4 uVar3;
  QMenuPrivate *this_00;
  undefined8 uVar4;
  Data *pDVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  CheckType CVar10;
  QPalette *pQVar11;
  QWidget *this_01;
  QMenu *pQVar12;
  long lVar13;
  QObject *pQVar14;
  qsizetype qVar15;
  long in_FS_OFFSET;
  QRect QVar16;
  QArrayDataPointer<char16_t> local_98;
  QKeySequence seq;
  QStringBuilder<char16_t,_QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0 || option == (QStyleOptionMenuItem *)0x0) goto LAB_0042309e;
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  QStyleOption::initFrom(&option->super_QStyleOption,&this->super_QWidget);
  pQVar11 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=(&(option->super_QStyleOption).palette,pQVar11);
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  this_01 = QWidget::window(&this->super_QWidget);
  bVar7 = QWidget::isActiveWindow(this_01);
  if (bVar7) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    cVar8 = QAction::isEnabled();
    if (cVar8 == '\0') goto LAB_00422dd3;
    pQVar12 = QAction::menu<QMenu*>(action);
    if (pQVar12 != (QMenu *)0x0) {
      pQVar12 = QAction::menu<QMenu*>(action);
      if ((((pQVar12->super_QWidget).data)->widget_attributes & 1) != 0) goto LAB_00422dd3;
    }
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  else {
LAB_00422dd3:
    (option->super_QStyleOption).palette.currentGroup = Disabled;
  }
  QAction::font();
  QFont::resolve((QFont *)&local_78);
  uVar4 = *(undefined8 *)&option->font;
  *(undefined8 *)&option->font = local_78._0_8_;
  uVar3 = *(undefined4 *)&option->field_0x90;
  *(undefined4 *)&option->field_0x90 = local_78.b.d.d._0_4_;
  local_78.b.d.d = (Data *)CONCAT44(local_78.b.d.d._4_4_,uVar3);
  local_78._0_8_ = uVar4;
  QFont::~QFont((QFont *)&local_78);
  QFont::~QFont((QFont *)&local_58);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_78,&option->font);
  uVar4 = *(undefined8 *)&(option->super_QStyleOption).fontMetrics;
  *(undefined8 *)&(option->super_QStyleOption).fontMetrics = local_78._0_8_;
  local_78._0_8_ = uVar4;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_78);
  if (this_00->currentAction == action) {
    cVar8 = QAction::isSeparator();
    if (cVar8 == '\0') {
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (uint)(QMenuPrivate::mouseDown != (QMenu *)0x0) << 2 |
           (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i | 0x8000;
    }
  }
  option->menuHasCheckableItems = (bool)((byte)this_00->field_0x420 >> 1 & 1);
  cVar8 = QAction::isCheckable();
  if (cVar8 == '\0') {
    option->checkType = NotCheckable;
  }
  else {
    lVar13 = QAction::actionGroup();
    if (lVar13 == 0) {
      CVar10 = NonExclusive;
    }
    else {
      QAction::actionGroup();
      bVar9 = QActionGroup::isExclusive();
      CVar10 = NonExclusive - bVar9;
    }
    option->checkType = CVar10;
    bVar7 = (bool)QAction::isChecked();
    option->checked = bVar7;
  }
  pQVar12 = QAction::menu<QMenu*>(action);
  if (pQVar12 == (QMenu *)0x0) {
    cVar8 = QAction::isSeparator();
    if (cVar8 == '\0') {
      pDVar5 = (this_00->defaultAction).wp.d;
      if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
        pQVar14 = (QObject *)0x0;
      }
      else {
        pQVar14 = (this_00->defaultAction).wp.value;
      }
      if (pQVar14 == (QObject *)action) {
        option->menuItemType = DefaultItem;
      }
      else {
        option->menuItemType = Normal;
      }
    }
    else {
      option->menuItemType = Separator;
    }
  }
  else {
    option->menuItemType = SubMenu;
  }
  cVar8 = QAction::isIconVisibleInMenu();
  if (cVar8 != '\0') {
    QAction::icon();
    QIcon::operator=(&option->icon,(QIcon *)&local_78);
    QIcon::~QIcon((QIcon *)&local_78);
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAction::text();
  cVar8 = QAction::isShortcutVisibleInContextMenu();
  if (cVar8 == '\0') {
    bVar7 = QMenuPrivate::isContextMenu(this_00);
    if (!bVar7) goto LAB_00422fc2;
  }
  else {
LAB_00422fc2:
    qVar15 = QString::indexOf((QString *)&local_58,(QChar)0x9,0,CaseSensitive);
    if (qVar15 == -1) {
      _seq = &DAT_aaaaaaaaaaaaaaaa;
      QAction::shortcut();
      cVar8 = QKeySequence::isEmpty();
      if (cVar8 == '\0') {
        QKeySequence::toString((SequenceFormat)&local_98);
        local_78.b.d.size = local_98.size;
        local_78.b.d.ptr = local_98.ptr;
        local_78.b.d.d = local_98.d;
        local_78.a = L'\t';
        local_98.d = (Data *)0x0;
        local_98.ptr = (char16_t *)0x0;
        local_98.size = 0;
        operator+=((QString *)&local_58,&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78.b.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
      QKeySequence::~QKeySequence(&seq);
    }
  }
  QString::operator=(&option->text,(QString *)&local_58);
  uVar6 = this_00->tabWidth;
  option->maxIconWidth = this_00->maxIconWidth;
  option->reservedShortcutWidth = uVar6;
  QVar16 = QWidget::rect(&this->super_QWidget);
  option->menuRect = QVar16;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0042309e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::initStyleOption(QStyleOptionMenuItem *option, const QAction *action) const
{
    if (!option || !action)
        return;

    Q_D(const QMenu);
    option->initFrom(this);
    option->palette = palette();
    option->state = QStyle::State_None;

    if (window()->isActiveWindow())
        option->state |= QStyle::State_Active;
    if (isEnabled() && action->isEnabled()
            && (!action->menu() || action->menu()->isEnabled()))
        option->state |= QStyle::State_Enabled;
    else
        option->palette.setCurrentColorGroup(QPalette::Disabled);

    option->font = action->font().resolve(font());
    option->fontMetrics = QFontMetrics(option->font);

    if (d->currentAction && d->currentAction == action && !d->currentAction->isSeparator()) {
        option->state |= QStyle::State_Selected
                     | (QMenuPrivate::mouseDown ? QStyle::State_Sunken : QStyle::State_None);
    }

    option->menuHasCheckableItems = d->hasCheckableItems;
    if (!action->isCheckable()) {
        option->checkType = QStyleOptionMenuItem::NotCheckable;
    } else {
        option->checkType = (action->actionGroup() && action->actionGroup()->isExclusive())
                            ? QStyleOptionMenuItem::Exclusive : QStyleOptionMenuItem::NonExclusive;
        option->checked = action->isChecked();
    }
    if (action->menu())
        option->menuItemType = QStyleOptionMenuItem::SubMenu;
    else if (action->isSeparator())
        option->menuItemType = QStyleOptionMenuItem::Separator;
    else if (d->defaultAction == action)
        option->menuItemType = QStyleOptionMenuItem::DefaultItem;
    else
        option->menuItemType = QStyleOptionMenuItem::Normal;
    if (action->isIconVisibleInMenu())
        option->icon = action->icon();
    QString textAndAccel = action->text();
#ifndef QT_NO_SHORTCUT
    if ((action->isShortcutVisibleInContextMenu() || !d->isContextMenu())
            && textAndAccel.indexOf(u'\t') == -1) {
        QKeySequence seq = action->shortcut();
        if (!seq.isEmpty())
            textAndAccel += u'\t' + seq.toString(QKeySequence::NativeText);
    }
#endif
    option->text = textAndAccel;
    option->reservedShortcutWidth = d->tabWidth;
    option->maxIconWidth = d->maxIconWidth;
    option->menuRect = rect();
}